

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O2

bool libebml::EbmlCrc32::CheckCRC(uint32 inputCRC,binary *input,uint32 length)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0xffffffffffffffff;
  lVar5 = 0;
  while( true ) {
    bVar1 = IsAlignedOn(input + lVar5,4);
    if ((bVar1) || (length == (uint32)lVar5)) break;
    uVar4 = (ulong)((uint)(uVar4 >> 8) & 0xffffff ^
                   *(uint *)(m_tab + (ulong)((uint)input[lVar5] ^ (uint)uVar4 & 0xff) * 4));
    lVar5 = lVar5 + 1;
  }
  for (uVar2 = length - (uint32)lVar5; 3 < uVar2; uVar2 = uVar2 - 4) {
    uVar3 = (uint)uVar4 ^ *(uint *)(input + lVar5);
    uVar3 = uVar3 >> 8 ^ *(uint *)(m_tab + (ulong)(uVar3 & 0xff) * 4);
    uVar3 = uVar3 >> 8 ^ *(uint *)(m_tab + (ulong)(uVar3 & 0xff) * 4);
    uVar3 = uVar3 >> 8 ^ *(uint *)(m_tab + (ulong)(uVar3 & 0xff) * 4);
    uVar4 = (ulong)(uVar3 >> 8 ^ *(uint *)(m_tab + (ulong)(uVar3 & 0xff) * 4));
    lVar5 = lVar5 + 4;
  }
  for (; uVar2 = (uint)uVar4, length != (uint32)lVar5; lVar5 = lVar5 + 1) {
    uVar4 = (ulong)(uVar2 >> 8 ^ *(uint *)(m_tab + (ulong)((uint)input[lVar5] ^ uVar2 & 0xff) * 4));
  }
  return (uVar2 ^ inputCRC) == 0xffffffff;
}

Assistant:

bool EbmlCrc32::CheckCRC(uint32 inputCRC, const binary *input, uint32 length)
{
  uint32 crc = CRC32_NEGL;

  for(; !IsAligned<uint32>(input) && length > 0; length--)
    crc = m_tab[CRC32_INDEX(crc) ^ *input++] ^ CRC32_SHIFTED(crc);

  while (length >= 4) {
    crc ^= *(const uint32 *)input;
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    crc = m_tab[CRC32_INDEX(crc)] ^ CRC32_SHIFTED(crc);
    length -= 4;
    input += 4;
  }

  while (length--)
    crc = m_tab[CRC32_INDEX(crc) ^ *input++] ^ CRC32_SHIFTED(crc);

  //Now we finalize the CRC32
  crc ^= CRC32_NEGL;

  if (crc == inputCRC)
    return true;

  return false;
}